

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

mbedtls_asn1_named_data *
mbedtls_asn1_find_named_data(mbedtls_asn1_named_data *list,char *oid,size_t len)

{
  int iVar1;
  size_t in_RDX;
  void *in_RSI;
  mbedtls_asn1_named_data *in_RDI;
  mbedtls_asn1_named_data *local_8;
  
  local_8 = in_RDI;
  while ((local_8 != (mbedtls_asn1_named_data *)0x0 &&
         (((local_8->oid).len != in_RDX ||
          (iVar1 = memcmp((local_8->oid).p,in_RSI,in_RDX), iVar1 != 0))))) {
    local_8 = local_8->next;
  }
  return local_8;
}

Assistant:

const mbedtls_asn1_named_data *mbedtls_asn1_find_named_data(const mbedtls_asn1_named_data *list,
                                                            const char *oid, size_t len)
{
    while (list != NULL) {
        if (list->oid.len == len &&
            memcmp(list->oid.p, oid, len) == 0) {
            break;
        }

        list = list->next;
    }

    return list;
}